

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> * __thiscall
fmt::v5::internal::
format_decimal<wchar_t,unsigned_int,fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,fmt::v5::internal::no_thousands_sep>
          (truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>
           *__return_storage_ptr__,undefined8 param_2,undefined8 param_3,char *param_4,
          undefined8 param_5,undefined8 param_6,undefined8 out,undefined8 param_8,size_t param_9,
          undefined8 param_10)

{
  truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> __result;
  char *__first;
  char_type buffer [13];
  __copy_move<false,false,std::random_access_iterator_tag> local_1d [13];
  
  __first = format_decimal<unsigned_int,char,fmt::v5::internal::no_thousands_sep>(local_1d);
  __result.super_truncating_iterator_base<wchar_t_*>.limit_ = param_8;
  __result.super_truncating_iterator_base<wchar_t_*>.out_ = (wchar_t *)out;
  __result.super_truncating_iterator_base<wchar_t_*>.count_ = param_9;
  __result._24_8_ = param_10;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char*,fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>>
            (__return_storage_ptr__,local_1d,__first,param_4,__result);
  return __return_storage_ptr__;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}